

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O3

void do_supps(CHAR_DATA *ch,char *argument)

{
  byte bVar1;
  short sVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  CClass *pCVar8;
  char *pcVar9;
  long lVar10;
  long lVar11;
  size_t sVar12;
  BUFFER *buffer;
  long lVar13;
  skill_type *psVar14;
  uint uVar15;
  char spell_columns [52];
  char buf [4608];
  char arg [4608];
  char spell_list [52] [4608];
  byte abStack_3cc78 [64];
  char acStack_3cc38 [4608];
  char acStack_3ba38 [4608];
  char acStack_3a838 [5];
  undefined8 auStack_3a833 [29952];
  
  bVar3 = is_npc(ch);
  if (bVar3) {
    return;
  }
  pCVar8 = ch->my_class;
  if ((pCVar8 == (CClass *)0x0) &&
     ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
      (pCVar8 = ch->pIndexData->my_class, pCVar8 == (CClass *)0x0)))) {
    pCVar8 = CClass::GetClass(0);
  }
  if ((pCVar8->ctype != 2) && (bVar3 = is_immortal(ch), !bVar3)) {
    send_to_char("Your class knows no prayers.\n\r",ch);
    return;
  }
  uVar15 = 1;
  uVar5 = 0x33;
  if ((*argument != '\0') && (bVar3 = str_prefix(argument,"all"), bVar3)) {
    pcVar9 = one_argument(argument,acStack_3ba38);
    bVar3 = is_number(acStack_3ba38);
    if (!bVar3) {
LAB_002d3e5e:
      pcVar9 = "Arguments must be numerical or all.\n\r";
      goto LAB_002d3e65;
    }
    uVar4 = atoi(acStack_3ba38);
    if (uVar4 - 0x34 < 0xffffffcd) {
LAB_002d3b46:
      pcVar9 = acStack_3cc38;
      sprintf(pcVar9,"Levels must be between 1 and %d.\n\r",0x33);
      goto LAB_002d3e65;
    }
    uVar5 = uVar4;
    if (*pcVar9 != '\0') {
      one_argument(pcVar9,acStack_3ba38);
      bVar3 = is_number(acStack_3ba38);
      if (!bVar3) goto LAB_002d3e5e;
      uVar5 = atoi(acStack_3ba38);
      if (uVar5 - 0x34 < 0xffffffcd) goto LAB_002d3b46;
      uVar15 = uVar4;
      if (uVar5 < uVar4) {
        pcVar9 = "That would be silly.\n\r";
        goto LAB_002d3e65;
      }
    }
  }
  abStack_3cc78[0x20] = 0;
  abStack_3cc78[0x21] = 0;
  abStack_3cc78[0x22] = 0;
  abStack_3cc78[0x23] = 0;
  abStack_3cc78[0x24] = 0;
  abStack_3cc78[0x25] = 0;
  abStack_3cc78[0x26] = 0;
  abStack_3cc78[0x27] = 0;
  abStack_3cc78[0x28] = 0;
  abStack_3cc78[0x29] = 0;
  abStack_3cc78[0x2a] = 0;
  abStack_3cc78[0x2b] = 0;
  abStack_3cc78[0x2c] = 0;
  abStack_3cc78[0x2d] = 0;
  abStack_3cc78[0x2e] = 0;
  abStack_3cc78[0x2f] = 0;
  abStack_3cc78[0x10] = 0;
  abStack_3cc78[0x11] = 0;
  abStack_3cc78[0x12] = 0;
  abStack_3cc78[0x13] = 0;
  abStack_3cc78[0x14] = 0;
  abStack_3cc78[0x15] = 0;
  abStack_3cc78[0x16] = 0;
  abStack_3cc78[0x17] = 0;
  abStack_3cc78[0x18] = 0;
  abStack_3cc78[0x19] = 0;
  abStack_3cc78[0x1a] = 0;
  abStack_3cc78[0x1b] = 0;
  abStack_3cc78[0x1c] = 0;
  abStack_3cc78[0x1d] = 0;
  abStack_3cc78[0x1e] = 0;
  abStack_3cc78[0x1f] = 0;
  abStack_3cc78[0] = 0;
  abStack_3cc78[1] = 0;
  abStack_3cc78[2] = 0;
  abStack_3cc78[3] = 0;
  abStack_3cc78[4] = 0;
  abStack_3cc78[5] = 0;
  abStack_3cc78[6] = 0;
  abStack_3cc78[7] = 0;
  abStack_3cc78[8] = 0;
  abStack_3cc78[9] = 0;
  abStack_3cc78[10] = 0;
  abStack_3cc78[0xb] = 0;
  abStack_3cc78[0xc] = 0;
  abStack_3cc78[0xd] = 0;
  abStack_3cc78[0xe] = 0;
  abStack_3cc78[0xf] = 0;
  abStack_3cc78[0x30] = 0;
  abStack_3cc78[0x31] = 0;
  abStack_3cc78[0x32] = 0;
  abStack_3cc78[0x33] = 0;
  lVar10 = 0;
  do {
    acStack_3a838[lVar10] = '\0';
    lVar10 = lVar10 + 0x1200;
  } while (lVar10 != 0x3a800);
  psVar14 = skill_table;
  lVar10 = 0;
  bVar3 = false;
  do {
    if (psVar14->name == (char *)0x0) break;
    pCVar8 = ch->my_class;
    if ((pCVar8 == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (pCVar8 = ch->pIndexData->my_class, pCVar8 == (CClass *)0x0)))) {
      pCVar8 = CClass::GetClass(0);
    }
    iVar6 = CClass::GetIndex(pCVar8);
    sVar2 = psVar14->skill_level[iVar6];
    if ((((((int)sVar2 <= (int)uVar5) && (sVar2 < 0x34)) && ((int)uVar15 <= (int)sVar2)) &&
        ((psVar14->spell_fun != spell_null && (0 < ch->pcdata->learned[lVar10])))) &&
       ((psVar14->ctype == 4 || (psVar14->ctype == 2)))) {
      pCVar8 = ch->my_class;
      if ((pCVar8 == (CClass *)0x0) &&
         ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
          (pCVar8 = ch->pIndexData->my_class, pCVar8 == (CClass *)0x0)))) {
        pCVar8 = CClass::GetClass(0);
      }
      iVar6 = CClass::GetIndex(pCVar8);
      uVar4 = (uint)psVar14->skill_level[iVar6];
      if (ch->level < psVar14->skill_level[iVar6]) {
        sprintf(acStack_3cc38,"%-18s n/a      ",psVar14->name);
      }
      else {
        uVar7 = (uint)(100 / (long)(int)(((int)ch->level - uVar4) + 2));
        if ((int)uVar7 <= (int)psVar14->min_mana) {
          uVar7 = (int)psVar14->min_mana;
        }
        sprintf(acStack_3cc38,"%-18s  %3d mana  ",psVar14->name,(ulong)uVar7);
      }
      lVar11 = (long)(int)uVar4;
      lVar13 = lVar11 * 0x1200;
      pcVar9 = acStack_3a838 + lVar13;
      if (*pcVar9 == '\0') {
        sprintf(pcVar9,"\n\rLevel %2d: %s",(ulong)uVar4,acStack_3cc38);
      }
      else {
        bVar1 = abStack_3cc78[lVar11];
        abStack_3cc78[lVar11] = bVar1 + 1;
        if ((bVar1 & 1) != 0) {
          sVar12 = strlen(pcVar9);
          builtin_strncpy(acStack_3a838 + sVar12 + lVar13,"\n\r      ",8);
          *(undefined8 *)((long)auStack_3a833 + sVar12 + lVar13) = 0x20202020202020;
        }
        strcat(pcVar9,acStack_3cc38);
      }
      bVar3 = true;
    }
    lVar10 = lVar10 + 1;
    psVar14 = psVar14 + 1;
  } while (lVar10 != 800);
  if (bVar3) {
    lVar10 = 0;
    buffer = new_buf();
    do {
      if (acStack_3a838[lVar10] != '\0') {
        add_buf(buffer,acStack_3a838 + lVar10);
      }
      lVar10 = lVar10 + 0x1200;
    } while (lVar10 != 0x3a800);
    add_buf(buffer,"\n\r");
    pcVar9 = buf_string(buffer);
    page_to_char(pcVar9,ch);
    free_buf(buffer);
    return;
  }
  pcVar9 = "No spells found.\n\r";
LAB_002d3e65:
  send_to_char(pcVar9,ch);
  return;
}

Assistant:

void do_supps(CHAR_DATA *ch, char *argument)
{
	BUFFER *buffer;
	char arg[MAX_INPUT_LENGTH];
	char spell_list[LEVEL_HERO + 1][MAX_STRING_LENGTH];
	char spell_columns[LEVEL_HERO + 1];
	int sn, level, min_lev = 1, max_lev = LEVEL_HERO, mana;
	bool fAll= false, found= false;
	char buf[MAX_STRING_LENGTH];

	if (is_npc(ch))
		return;

	if (ch->Class()->ctype != CLASS_COMMUNER && !is_immortal(ch))
	{
		send_to_char("Your class knows no prayers.\n\r", ch);
		return;
	}

	if (argument[0] != '\0')
	{
		fAll = true;

		if (str_prefix(argument, "all"))
		{
			argument = one_argument(argument, arg);

			if (!is_number(arg))
			{
				send_to_char("Arguments must be numerical or all.\n\r", ch);
				return;
			}

			max_lev = atoi(arg);

			if (max_lev < 1 || max_lev > LEVEL_HERO)
			{
				sprintf(buf, "Levels must be between 1 and %d.\n\r", LEVEL_HERO);
				send_to_char(buf, ch);
				return;
			}

			if (argument[0] != '\0')
			{
				argument = one_argument(argument, arg);
				if (!is_number(arg))
				{
					send_to_char("Arguments must be numerical or all.\n\r", ch);
					return;
				}

				min_lev = max_lev;
				max_lev = atoi(arg);

				if (max_lev < 1 || max_lev > LEVEL_HERO)
				{
					sprintf(buf, "Levels must be between 1 and %d.\n\r", LEVEL_HERO);
					send_to_char(buf, ch);
					return;
				}

				if (min_lev > max_lev)
				{
					send_to_char("That would be silly.\n\r", ch);
					return;
				}
			}
		}
	}

	/* initialize data */
	for (level = 0; level < LEVEL_HERO + 1; level++)
	{
		spell_columns[level] = 0;
		spell_list[level][0] = '\0';
	}

	for (sn = 0; sn < MAX_SKILL; sn++)
	{
		if (skill_table[sn].name == nullptr)
			break;

		level = skill_table[sn].skill_level[ch->Class()->GetIndex()];

		if (level < LEVEL_HERO + 1
			&& level >= min_lev
			&& level <= max_lev
			&& skill_table[sn].spell_fun != spell_null
			&& ch->pcdata->learned[sn] > 0
			&& (skill_table[sn].ctype == CMD_COMMUNE || skill_table[sn].ctype == CMD_BOTH))
		{
			found = true;
			level = skill_table[sn].skill_level[ch->Class()->GetIndex()];

			if (ch->level < level)
			{
				sprintf(buf, "%-18s n/a      ", skill_table[sn].name);
			}
			else
			{
				mana = std::max((int)skill_table[sn].min_mana, 100 / (2 + ch->level - level));
				sprintf(buf, "%-18s  %3d mana  ", skill_table[sn].name, mana);
			}

			if (spell_list[level][0] == '\0')
			{
				sprintf(spell_list[level], "\n\rLevel %2d: %s", level, buf);
			}
			else /* append */
			{
				if (++spell_columns[level] % 2 == 0)
					strcat(spell_list[level], "\n\r          ");

				strcat(spell_list[level], buf);
			}
		}
	}

	/* return results */

	if (!found)
	{
		send_to_char("No spells found.\n\r", ch);
		return;
	}

	buffer = new_buf();

	for (level = 0; level < LEVEL_HERO + 1; level++)
	{
		if (spell_list[level][0] != '\0')
			add_buf(buffer, spell_list[level]);
	}

	add_buf(buffer, "\n\r");
	page_to_char(buf_string(buffer), ch);
	free_buf(buffer);
}